

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SpectrumDotsTexture *
pbrt::SpectrumDotsTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpectrumDotsTexture *pSVar3;
  Allocator alloc_00;
  Allocator alloc_01;
  uintptr_t iptr;
  TextureMapping2DHandle map;
  undefined1 local_98 [8];
  NamedTextures *local_90;
  undefined1 local_80 [24];
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_68;
  SpectrumHandle local_60 [2];
  long local_50 [2];
  _Base_ptr local_40;
  _Base_ptr local_38;
  undefined4 extraout_var_01;
  
  TextureMapping2DHandle::Create
            ((TextureMapping2DHandle *)&local_68,parameters->dict,renderFromTexture,loc,alloc);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0;
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = 0x3f800000;
  local_90 = (NamedTextures *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"inside","");
  alloc_00.memoryResource._4_4_ = 0;
  alloc_00.memoryResource._0_4_ = spectrumType;
  local_38 = (_Base_ptr)(CONCAT44(extraout_var_00,iVar2) | 0x1000000000000);
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)(local_80 + 0x10),(string *)parameters,
             (SpectrumHandle *)&local_90,(SpectrumType)&local_38,alloc_00);
  local_60[0].
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"outside","");
  local_40 = (_Base_ptr)(CONCAT44(extraout_var,iVar1) | 0x1000000000000);
  alloc_01.memoryResource._4_4_ = 0;
  alloc_01.memoryResource._0_4_ = spectrumType;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)local_98,(string *)parameters,local_60,
             (SpectrumType)&local_40,alloc_01);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pSVar3 = (SpectrumDotsTexture *)CONCAT44(extraout_var_01,iVar1);
  (pSVar3->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = local_68.bits;
  (pSVar3->outsideDot).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = local_80._16_8_;
  (pSVar3->insideDot).
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  .bits = (uintptr_t)local_98;
  if (local_60[0].
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits != (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                )local_50) {
    operator_delete((void *)local_60[0].
                            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                            .bits,local_50[0] + 1);
  }
  if (local_90 != (NamedTextures *)local_80) {
    operator_delete(local_90,local_80._0_8_ + 1);
  }
  return pSVar3;
}

Assistant:

SpectrumDotsTexture *SpectrumDotsTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);
    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    return alloc.new_object<SpectrumDotsTexture>(
        map, parameters.GetSpectrumTexture("inside", one, spectrumType, alloc),
        parameters.GetSpectrumTexture("outside", zero, spectrumType, alloc));
}